

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  ImGuiContext *g;
  char *__function;
  ImGuiViewportP *viewport;
  float fVar8;
  ImVec2 IVar9;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar2 = (GImGui->CurrentWindowStack).Size;
  if (iVar2 < 2) {
    if (GImGui->WithinFrameScopeWithImplicitWindow == true) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                    ,0x1a27,"void ImGui::End()");
    }
    if (iVar2 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                    ,0x1a2a,"void ImGui::End()");
    }
  }
  uVar7 = pIVar3->Flags;
  if ((((uVar7 >> 0x18 & 1) != 0) && ((pIVar3->field_0x482 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x1a2e,"void ImGui::End()");
  }
  if ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
    uVar7 = pIVar3->Flags;
  }
  if ((uVar7 >> 0x1d & 1) == 0) {
    PopClipRect();
    uVar7 = pIVar3->Flags;
  }
  if ((uVar7 >> 0x18 & 1) == 0) {
    LogFinish();
  }
  if (((pIVar3->DockNode != (ImGuiDockNode *)0x0) && ((pIVar3->field_0x482 & 2) != 0)) &&
     (pIVar4 = pIVar3->DockNode->HostWindow, pIVar4 != (ImGuiWindow *)0x0)) {
    IVar1 = (pIVar3->DC).CursorMaxPos;
    IVar9.x = (IVar1.x + (pIVar3->WindowPadding).x) - (pIVar4->WindowPadding).x;
    IVar9.y = (IVar1.y + (pIVar3->WindowPadding).y) - (pIVar4->WindowPadding).y;
    (pIVar4->DC).CursorMaxPos = IVar9;
  }
  iVar2 = (pIVar5->CurrentWindowStack).Size;
  if (0 < iVar2) {
    (pIVar5->CurrentWindowStack).Size = iVar2 + -1;
    if ((pIVar3->Flags & 0x4000000) != 0) {
      iVar2 = (pIVar5->BeginPopupStack).Size;
      if (iVar2 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_001dad68;
      }
      (pIVar5->BeginPopupStack).Size = iVar2 + -1;
    }
    viewport = (ImGuiViewportP *)0x0;
    ErrorCheckBeginEndCompareStacksSize(pIVar3,false);
    pIVar6 = GImGui;
    uVar7 = (pIVar5->CurrentWindowStack).Size;
    if ((ulong)uVar7 == 0) {
      GImGui->CurrentWindow = (ImGuiWindow *)0x0;
    }
    else {
      if ((int)uVar7 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                      ,0x639,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
      }
      pIVar3 = (pIVar5->CurrentWindowStack).Data[(ulong)uVar7 - 1];
      GImGui->CurrentWindow = pIVar3;
      if (pIVar3 != (ImGuiWindow *)0x0) {
        fVar8 = pIVar6->FontBaseSize * pIVar3->FontWindowScale * pIVar3->FontDpiScale;
        if (pIVar3->ParentWindow != (ImGuiWindow *)0x0) {
          fVar8 = fVar8 * pIVar3->ParentWindow->FontWindowScale;
        }
        (pIVar6->DrawListSharedData).FontSize = fVar8;
        pIVar6->FontSize = fVar8;
      }
    }
    if (pIVar5->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport((ImGuiWindow *)pIVar5->CurrentWindow->Viewport,viewport);
      return;
    }
    return;
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_001dad68:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                ,0x645,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}